

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O1

S2Point * S2::Ortho(S2Point *__return_storage_ptr__,S2Point *a)

{
  double *pdVar1;
  int iVar2;
  int b;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  S2Point temp;
  double local_30;
  double local_28;
  double local_20;
  
  dVar3 = ABS(a->c_[0]);
  dVar4 = ABS(a->c_[2]);
  dVar5 = ABS(a->c_[1]);
  iVar2 = (dVar5 <= dVar4) + 1;
  if (dVar5 < dVar3) {
    iVar2 = (uint)(dVar3 <= dVar4) * 2;
  }
  b = 2;
  if (dVar3 <= dVar4) {
    b = iVar2 + -1;
  }
  if (dVar3 <= dVar5) {
    b = iVar2 + -1;
  }
  local_30 = 0.012;
  local_28 = 0.0053;
  local_20 = 0.00457;
  pdVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)&local_30,b);
  *pdVar1 = 1.0;
  dVar4 = a->c_[1] * local_20 - a->c_[2] * local_28;
  dVar5 = a->c_[2] * local_30 - local_20 * a->c_[0];
  dVar6 = local_28 * a->c_[0] - a->c_[1] * local_30;
  dVar3 = dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                  (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
  __return_storage_ptr__->c_[0] = dVar4 * dVar3;
  __return_storage_ptr__->c_[1] = dVar5 * dVar3;
  __return_storage_ptr__->c_[2] = dVar6 * dVar3;
  return __return_storage_ptr__;
}

Assistant:

S2Point Ortho(const S2Point& a) {
#ifdef S2_TEST_DEGENERACIES
  // Vector3::Ortho() always returns a point on the X-Y, Y-Z, or X-Z planes.
  // This leads to many more degenerate cases in polygon operations.
  return a.Ortho();
#else
  int k = a.LargestAbsComponent() - 1;
  if (k < 0) k = 2;
  S2Point temp(0.012, 0.0053, 0.00457);
  temp[k] = 1;
  return a.CrossProd(temp).Normalize();
#endif
}